

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_intmin_max(ASMState *as,IRIns *ir,int cc)

{
  Reg RVar1;
  uint uVar2;
  uint ref;
  Reg r2;
  int iVar3;
  Reg in_EDX;
  ASMState *in_RSI;
  ASMState *in_RDI;
  IRRef rref;
  IRRef lref;
  Reg dest;
  Reg right;
  RegSet in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffe4;
  
  RVar1 = ra_dest((ASMState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                  (IRIns *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
  uVar2 = (uint)*(ushort *)((long)in_RSI->cost + 2);
  ref = uVar2;
  uVar4 = (uint)(ushort)in_RSI->cost[0];
  if (uVar2 < 0x8000) {
    ref = (uint)(ushort)in_RSI->cost[0];
    uVar4 = uVar2;
  }
  r2 = ra_alloc1((ASMState *)CONCAT44(RVar1,uVar4),ref,in_stack_ffffffffffffffd8);
  iVar3 = 0;
  if ((0x604208U >> ((byte)in_RSI->cost[1] & 0x1f) & 1) != 0) {
    iVar3 = 0x80200;
  }
  emit_rr(in_RDI,in_EDX * 0x1000000 + XO_CMOV,RVar1 + iVar3,r2);
  iVar3 = 0;
  if ((0x604208U >> ((byte)in_RSI->cost[1] & 0x1f) & 1) != 0) {
    iVar3 = 0x80200;
  }
  emit_rr(in_RDI,XO_CMP,RVar1 + iVar3,r2);
  ra_left(in_RSI,in_EDX,r2);
  return;
}

Assistant:

static void asm_intmin_max(ASMState *as, IRIns *ir, int cc)
{
  Reg right, dest = ra_dest(as, ir, RSET_GPR);
  IRRef lref = ir->op1, rref = ir->op2;
  if (irref_isk(rref)) { lref = rref; rref = ir->op1; }
  right = ra_alloc1(as, rref, rset_exclude(RSET_GPR, dest));
  emit_rr(as, XO_CMOV + (cc<<24), REX_64IR(ir, dest), right);
  emit_rr(as, XO_CMP, REX_64IR(ir, dest), right);
  ra_left(as, dest, lref);
}